

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O3

void __thiscall Movegen::generate<(Movetype)14,(Piece)6>(Movegen *this)

{
  Square *pSVar1;
  Color CVar2;
  long lVar3;
  byte bVar4;
  bool bVar5;
  U8 UVar6;
  ulong uVar7;
  Square *pSVar8;
  U64 UVar9;
  U64 UVar10;
  int iVar11;
  code *pcVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  U8 *pUVar16;
  Square SVar17;
  U8 UVar18;
  ulong uVar19;
  bool bVar20;
  ulong local_40;
  ulong local_38;
  
  uVar7 = this->check_target;
  if (uVar7 == 0) {
    generate<(Movetype)16,(Piece)0>(this);
    if (this->pawns7 != 0) {
      pcVar12 = anon_unknown.dwarf_15ec2b::shift<(Dir)1>;
      if (this->us == white) {
        pcVar12 = anon_unknown.dwarf_15ec2b::shift<(Dir)0>;
      }
      local_38 = this->pawns7;
      (*pcVar12)(&local_38);
      uVar7 = local_38 & this->qtarget;
      if (uVar7 != 0) {
        CVar2 = this->us;
        uVar13 = (ulong)this->last;
        pUVar16 = &this->list[uVar13 + 3].type;
        do {
          lVar3 = 0;
          if (uVar7 != 0) {
            for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
            }
          }
          UVar6 = (U8)lVar3;
          UVar18 = (CVar2 != white) * '\x10' + -8 + UVar6;
          uVar14 = (int)uVar13 + 4;
          uVar13 = (ulong)uVar14;
          pUVar16[-0xb] = UVar18;
          pUVar16[-10] = UVar6;
          pUVar16[-9] = 0;
          pUVar16[-8] = UVar18;
          pUVar16[-7] = UVar6;
          pUVar16[-6] = 1;
          pUVar16[-5] = UVar18;
          pUVar16[-4] = UVar6;
          pUVar16[-3] = 2;
          ((Move *)(pUVar16 + -2))->f = UVar18;
          pUVar16[-1] = UVar6;
          *pUVar16 = '\x03';
          pUVar16 = pUVar16 + 0xc;
          uVar7 = uVar7 & uVar7 - 1;
        } while (uVar7 != 0);
        this->last = uVar14;
      }
    }
    pSVar8 = this->knights;
    SVar17 = *pSVar8;
    if (SVar17 != no_square) {
      iVar11 = this->last;
      uVar7 = this->qtarget;
      uVar13 = this->ctarget;
      do {
        uVar15 = (&bitboards::nmask)[SVar17];
        uVar19 = uVar15 & uVar7;
        if (uVar19 != 0) {
          pUVar16 = &this->list[iVar11].type;
          do {
            lVar3 = 0;
            if (uVar19 != 0) {
              for (; (uVar19 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar16 + -2))->f = (U8)SVar17;
            pUVar16[-1] = (U8)lVar3;
            *pUVar16 = '\n';
            pUVar16 = pUVar16 + 3;
            iVar11 = iVar11 + 1;
            uVar19 = uVar19 & uVar19 - 1;
          } while (uVar19 != 0);
          this->last = iVar11;
        }
        uVar15 = uVar15 & uVar13;
        if (uVar15 != 0) {
          pUVar16 = &this->list[iVar11].type;
          do {
            lVar3 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar16 + -2))->f = (U8)SVar17;
            pUVar16[-1] = (U8)lVar3;
            *pUVar16 = '\v';
            pUVar16 = pUVar16 + 3;
            iVar11 = iVar11 + 1;
            uVar15 = uVar15 & uVar15 - 1;
          } while (uVar15 != 0);
          this->last = iVar11;
        }
        SVar17 = pSVar8[1];
        pSVar8 = pSVar8 + 1;
      } while (SVar17 != no_square);
    }
    pSVar8 = this->bishops;
    if (*pSVar8 != no_square) {
      do {
        UVar9 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar8);
        uVar7 = this->qtarget & UVar9;
        if (uVar7 != 0) {
          SVar17 = *pSVar8;
          uVar13 = (ulong)this->last;
          pUVar16 = &this->list[uVar13].type;
          do {
            lVar3 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar16 + -2))->f = (char)SVar17;
            pUVar16[-1] = (U8)lVar3;
            *pUVar16 = '\n';
            pUVar16 = pUVar16 + 3;
            uVar14 = (int)uVar13 + 1;
            uVar13 = (ulong)uVar14;
            uVar7 = uVar7 & uVar7 - 1;
          } while (uVar7 != 0);
          this->last = uVar14;
        }
        uVar7 = UVar9 & this->ctarget;
        if (uVar7 != 0) {
          SVar17 = *pSVar8;
          uVar13 = (ulong)this->last;
          pUVar16 = &this->list[uVar13].type;
          do {
            lVar3 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar16 + -2))->f = (char)SVar17;
            pUVar16[-1] = (U8)lVar3;
            *pUVar16 = '\v';
            pUVar16 = pUVar16 + 3;
            uVar14 = (int)uVar13 + 1;
            uVar13 = (ulong)uVar14;
            uVar7 = uVar7 & uVar7 - 1;
          } while (uVar7 != 0);
          this->last = uVar14;
        }
        pSVar1 = pSVar8 + 1;
        pSVar8 = pSVar8 + 1;
      } while (*pSVar1 != no_square);
    }
    pSVar8 = this->rooks;
    if (*pSVar8 != no_square) {
      do {
        UVar9 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar8);
        uVar7 = this->qtarget & UVar9;
        if (uVar7 != 0) {
          SVar17 = *pSVar8;
          uVar13 = (ulong)this->last;
          pUVar16 = &this->list[uVar13].type;
          do {
            lVar3 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar16 + -2))->f = (char)SVar17;
            pUVar16[-1] = (U8)lVar3;
            *pUVar16 = '\n';
            pUVar16 = pUVar16 + 3;
            uVar14 = (int)uVar13 + 1;
            uVar13 = (ulong)uVar14;
            uVar7 = uVar7 & uVar7 - 1;
          } while (uVar7 != 0);
          this->last = uVar14;
        }
        uVar7 = UVar9 & this->ctarget;
        if (uVar7 != 0) {
          SVar17 = *pSVar8;
          uVar13 = (ulong)this->last;
          pUVar16 = &this->list[uVar13].type;
          do {
            lVar3 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar16 + -2))->f = (char)SVar17;
            pUVar16[-1] = (U8)lVar3;
            *pUVar16 = '\v';
            pUVar16 = pUVar16 + 3;
            uVar14 = (int)uVar13 + 1;
            uVar13 = (ulong)uVar14;
            uVar7 = uVar7 & uVar7 - 1;
          } while (uVar7 != 0);
          this->last = uVar14;
        }
        pSVar1 = pSVar8 + 1;
        pSVar8 = pSVar8 + 1;
      } while (*pSVar1 != no_square);
    }
    pSVar8 = this->queens;
    if (*pSVar8 != no_square) {
      do {
        UVar9 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar8);
        UVar10 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar8);
        uVar7 = this->qtarget & (UVar10 | UVar9);
        if (uVar7 != 0) {
          SVar17 = *pSVar8;
          uVar13 = (ulong)this->last;
          pUVar16 = &this->list[uVar13].type;
          do {
            lVar3 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar16 + -2))->f = (char)SVar17;
            pUVar16[-1] = (U8)lVar3;
            *pUVar16 = '\n';
            pUVar16 = pUVar16 + 3;
            uVar14 = (int)uVar13 + 1;
            uVar13 = (ulong)uVar14;
            uVar7 = uVar7 & uVar7 - 1;
          } while (uVar7 != 0);
          this->last = uVar14;
        }
        uVar7 = (UVar10 | UVar9) & this->ctarget;
        if (uVar7 != 0) {
          SVar17 = *pSVar8;
          uVar13 = (ulong)this->last;
          pUVar16 = &this->list[uVar13].type;
          do {
            lVar3 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar16 + -2))->f = (char)SVar17;
            pUVar16[-1] = (U8)lVar3;
            *pUVar16 = '\v';
            pUVar16 = pUVar16 + 3;
            uVar14 = (int)uVar13 + 1;
            uVar13 = (ulong)uVar14;
            uVar7 = uVar7 & uVar7 - 1;
          } while (uVar7 != 0);
          this->last = uVar14;
        }
        pSVar1 = pSVar8 + 1;
        pSVar8 = pSVar8 + 1;
      } while (*pSVar1 != no_square);
    }
    generate<(Movetype)11,(Piece)0>(this);
    uVar7 = (ulong)this->us;
    local_40 = this->pawns;
    if (local_40 != 0) {
      local_38 = *(ulong *)(bitboards::pawnmask + uVar7 * 8) & local_40;
      local_40 = local_40 & this->rank2;
      pcVar12 = anon_unknown.dwarf_15ec2b::shift<(Dir)1>;
      if (uVar7 == 0) {
        pcVar12 = anon_unknown.dwarf_15ec2b::shift<(Dir)0>;
      }
      (*pcVar12)(&local_38);
      local_38 = local_38 & this->qtarget;
      bVar5 = true;
      do {
        bVar20 = bVar5;
        (*pcVar12)(&local_40);
        local_40 = local_40 & this->empty;
        bVar5 = false;
      } while (bVar20);
      local_40 = (-(ulong)(this->evasion_target == 0) | this->evasion_target) & local_40;
      if (local_38 != 0) {
        uVar13 = (ulong)this->last;
        pUVar16 = &this->list[uVar13].type;
        do {
          lVar3 = 0;
          if (local_38 != 0) {
            for (; (local_38 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
            }
          }
          ((Move *)(pUVar16 + -2))->f = (U8)lVar3 + (uVar7 != 0) * '\x10' + -8;
          pUVar16[-1] = (U8)lVar3;
          *pUVar16 = '\n';
          pUVar16 = pUVar16 + 3;
          uVar14 = (int)uVar13 + 1;
          uVar13 = (ulong)uVar14;
          local_38 = local_38 & local_38 - 1;
        } while (local_38 != 0);
        this->last = uVar14;
      }
      if (local_40 != 0) {
        uVar13 = (ulong)this->last;
        pUVar16 = &this->list[uVar13].type;
        do {
          lVar3 = 0;
          if (local_40 != 0) {
            for (; (local_40 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
            }
          }
          ((Move *)(pUVar16 + -2))->f = (uVar7 != 0) * ' ' + -0x10 + (U8)lVar3;
          pUVar16[-1] = (U8)lVar3;
          *pUVar16 = '\n';
          pUVar16 = pUVar16 + 3;
          uVar14 = (int)uVar13 + 1;
          uVar13 = (ulong)uVar14;
          local_40 = local_40 & local_40 - 1;
        } while (local_40 != 0);
        this->last = uVar14;
      }
    }
    uVar7 = (&bitboards::kmask)[*this->kings];
    uVar13 = this->empty & uVar7;
    UVar6 = (U8)*this->kings;
    if (uVar13 != 0) {
      uVar15 = (ulong)this->last;
      pUVar16 = &this->list[uVar15].type;
      do {
        lVar3 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        ((Move *)(pUVar16 + -2))->f = UVar6;
        pUVar16[-1] = (U8)lVar3;
        *pUVar16 = '\n';
        pUVar16 = pUVar16 + 3;
        uVar14 = (int)uVar15 + 1;
        uVar15 = (ulong)uVar14;
        uVar13 = uVar13 & uVar13 - 1;
      } while (uVar13 != 0);
      this->last = uVar14;
    }
    if (this->can_castle_ks == true) {
      iVar11 = this->last;
      this->last = iVar11 + 1;
      UVar18 = '>';
      if (this->us == white) {
        UVar18 = '\x06';
      }
      this->list[iVar11].f = UVar6;
      this->list[iVar11].t = UVar18;
      this->list[iVar11].type = '\b';
    }
    if (this->can_castle_qs == true) {
      iVar11 = this->last;
      this->last = iVar11 + 1;
      UVar18 = ':';
      if (this->us == white) {
        UVar18 = '\x02';
      }
      this->list[iVar11].f = UVar6;
      this->list[iVar11].t = UVar18;
      this->list[iVar11].type = '\t';
    }
    uVar7 = uVar7 & this->enemies;
    if (uVar7 == 0) {
      return;
    }
    uVar13 = (ulong)this->last;
    pUVar16 = &this->list[uVar13].type;
    do {
      lVar3 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
        }
      }
      ((Move *)(pUVar16 + -2))->f = UVar6;
      pUVar16[-1] = (U8)lVar3;
      *pUVar16 = '\v';
      pUVar16 = pUVar16 + 3;
      uVar14 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar14;
      uVar7 = uVar7 & uVar7 - 1;
    } while (uVar7 != 0);
  }
  else {
    uVar7 = uVar7 - (uVar7 >> 1 & 0x5555555555555555);
    uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
    bVar4 = (byte)(((uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
    if (this->evasion_target == 0) {
      if (bVar4 < 2) {
        generate<(Movetype)16,(Piece)0>(this);
        SVar17 = *this->kings;
        uVar7 = this->enemies & (&bitboards::kmask)[SVar17];
        if (uVar7 != 0) {
          uVar13 = (ulong)this->last;
          pUVar16 = &this->list[uVar13].type;
          do {
            lVar3 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar16 + -2))->f = (U8)SVar17;
            pUVar16[-1] = (U8)lVar3;
            *pUVar16 = '\v';
            pUVar16 = pUVar16 + 3;
            uVar14 = (int)uVar13 + 1;
            uVar13 = (ulong)uVar14;
            uVar7 = uVar7 & uVar7 - 1;
          } while (uVar7 != 0);
          this->last = uVar14;
        }
        generate<(Movetype)11,(Piece)0>(this);
        pSVar8 = this->knights;
        SVar17 = *pSVar8;
        if (SVar17 != no_square) {
          iVar11 = this->last;
          uVar7 = this->ctarget;
          do {
            uVar13 = (&bitboards::nmask)[SVar17] & uVar7;
            if (uVar13 != 0) {
              pUVar16 = &this->list[iVar11].type;
              do {
                lVar3 = 0;
                if (uVar13 != 0) {
                  for (; (uVar13 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar16 + -2))->f = (U8)SVar17;
                pUVar16[-1] = (U8)lVar3;
                *pUVar16 = '\v';
                pUVar16 = pUVar16 + 3;
                iVar11 = iVar11 + 1;
                uVar13 = uVar13 & uVar13 - 1;
              } while (uVar13 != 0);
              this->last = iVar11;
            }
            SVar17 = pSVar8[1];
            pSVar8 = pSVar8 + 1;
          } while (SVar17 != no_square);
        }
        pSVar8 = this->bishops;
        if (*pSVar8 != no_square) {
          do {
            UVar9 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar8);
            uVar7 = UVar9 & this->ctarget;
            if (uVar7 != 0) {
              SVar17 = *pSVar8;
              uVar13 = (ulong)this->last;
              pUVar16 = &this->list[uVar13].type;
              do {
                lVar3 = 0;
                if (uVar7 != 0) {
                  for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar16 + -2))->f = (char)SVar17;
                pUVar16[-1] = (U8)lVar3;
                *pUVar16 = '\v';
                pUVar16 = pUVar16 + 3;
                uVar14 = (int)uVar13 + 1;
                uVar13 = (ulong)uVar14;
                uVar7 = uVar7 & uVar7 - 1;
              } while (uVar7 != 0);
              this->last = uVar14;
            }
            pSVar1 = pSVar8 + 1;
            pSVar8 = pSVar8 + 1;
          } while (*pSVar1 != no_square);
        }
        pSVar8 = this->rooks;
        if (*pSVar8 != no_square) {
          do {
            UVar9 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar8);
            uVar7 = UVar9 & this->ctarget;
            if (uVar7 != 0) {
              SVar17 = *pSVar8;
              uVar13 = (ulong)this->last;
              pUVar16 = &this->list[uVar13].type;
              do {
                lVar3 = 0;
                if (uVar7 != 0) {
                  for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar16 + -2))->f = (char)SVar17;
                pUVar16[-1] = (U8)lVar3;
                *pUVar16 = '\v';
                pUVar16 = pUVar16 + 3;
                uVar14 = (int)uVar13 + 1;
                uVar13 = (ulong)uVar14;
                uVar7 = uVar7 & uVar7 - 1;
              } while (uVar7 != 0);
              this->last = uVar14;
            }
            pSVar1 = pSVar8 + 1;
            pSVar8 = pSVar8 + 1;
          } while (*pSVar1 != no_square);
        }
        pSVar8 = this->queens;
        if (*pSVar8 != no_square) {
          do {
            UVar9 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar8);
            UVar10 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar8);
            uVar7 = (UVar10 | UVar9) & this->ctarget;
            if (uVar7 != 0) {
              SVar17 = *pSVar8;
              uVar13 = (ulong)this->last;
              pUVar16 = &this->list[uVar13].type;
              do {
                lVar3 = 0;
                if (uVar7 != 0) {
                  for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar16 + -2))->f = (char)SVar17;
                pUVar16[-1] = (U8)lVar3;
                *pUVar16 = '\v';
                pUVar16 = pUVar16 + 3;
                uVar14 = (int)uVar13 + 1;
                uVar13 = (ulong)uVar14;
                uVar7 = uVar7 & uVar7 - 1;
              } while (uVar7 != 0);
              this->last = uVar14;
            }
            pSVar1 = pSVar8 + 1;
            pSVar8 = pSVar8 + 1;
          } while (*pSVar1 != no_square);
        }
        SVar17 = *this->kings;
        uVar7 = this->empty & (&bitboards::kmask)[SVar17];
        if (uVar7 == 0) {
          return;
        }
        uVar13 = (ulong)this->last;
        pUVar16 = &this->list[uVar13].type;
        do {
          lVar3 = 0;
          if (uVar7 != 0) {
            for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
            }
          }
          ((Move *)(pUVar16 + -2))->f = (U8)SVar17;
          pUVar16[-1] = (U8)lVar3;
          *pUVar16 = '\n';
          pUVar16 = pUVar16 + 3;
          uVar14 = (int)uVar13 + 1;
          uVar13 = (ulong)uVar14;
          uVar7 = uVar7 & uVar7 - 1;
        } while (uVar7 != 0);
      }
      else {
        uVar7 = (&bitboards::kmask)[*this->kings];
        uVar13 = this->enemies & uVar7;
        UVar6 = (U8)*this->kings;
        if (uVar13 != 0) {
          uVar15 = (ulong)this->last;
          pUVar16 = &this->list[uVar15].type;
          do {
            lVar3 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar16 + -2))->f = UVar6;
            pUVar16[-1] = (U8)lVar3;
            *pUVar16 = '\v';
            pUVar16 = pUVar16 + 3;
            uVar14 = (int)uVar15 + 1;
            uVar15 = (ulong)uVar14;
            uVar13 = uVar13 & uVar13 - 1;
          } while (uVar13 != 0);
          this->last = uVar14;
        }
        uVar7 = uVar7 & this->empty;
        if (uVar7 == 0) {
          return;
        }
        uVar13 = (ulong)this->last;
        pUVar16 = &this->list[uVar13].type;
        do {
          lVar3 = 0;
          if (uVar7 != 0) {
            for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
            }
          }
          ((Move *)(pUVar16 + -2))->f = UVar6;
          pUVar16[-1] = (U8)lVar3;
          *pUVar16 = '\n';
          pUVar16 = pUVar16 + 3;
          uVar14 = (int)uVar13 + 1;
          uVar13 = (ulong)uVar14;
          uVar7 = uVar7 & uVar7 - 1;
        } while (uVar7 != 0);
      }
    }
    else {
      if (bVar4 < 2) {
        generate<(Movetype)16,(Piece)0>(this);
        SVar17 = *this->kings;
        uVar7 = this->enemies & (&bitboards::kmask)[SVar17];
        if (uVar7 != 0) {
          uVar13 = (ulong)this->last;
          pUVar16 = &this->list[uVar13].type;
          do {
            lVar3 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar16 + -2))->f = (U8)SVar17;
            pUVar16[-1] = (U8)lVar3;
            *pUVar16 = '\v';
            pUVar16 = pUVar16 + 3;
            uVar14 = (int)uVar13 + 1;
            uVar13 = (ulong)uVar14;
            uVar7 = uVar7 & uVar7 - 1;
          } while (uVar7 != 0);
          this->last = uVar14;
        }
        generate<(Movetype)11,(Piece)0>(this);
        pSVar8 = this->knights;
        SVar17 = *pSVar8;
        if (SVar17 != no_square) {
          iVar11 = this->last;
          uVar7 = this->qtarget;
          uVar13 = this->ctarget;
          do {
            uVar15 = (&bitboards::nmask)[SVar17];
            uVar19 = uVar15 & uVar7;
            if (uVar19 != 0) {
              pUVar16 = &this->list[iVar11].type;
              do {
                lVar3 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar16 + -2))->f = (U8)SVar17;
                pUVar16[-1] = (U8)lVar3;
                *pUVar16 = '\n';
                pUVar16 = pUVar16 + 3;
                iVar11 = iVar11 + 1;
                uVar19 = uVar19 & uVar19 - 1;
              } while (uVar19 != 0);
              this->last = iVar11;
            }
            uVar15 = uVar15 & uVar13;
            if (uVar15 != 0) {
              pUVar16 = &this->list[iVar11].type;
              do {
                lVar3 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar16 + -2))->f = (U8)SVar17;
                pUVar16[-1] = (U8)lVar3;
                *pUVar16 = '\v';
                pUVar16 = pUVar16 + 3;
                iVar11 = iVar11 + 1;
                uVar15 = uVar15 & uVar15 - 1;
              } while (uVar15 != 0);
              this->last = iVar11;
            }
            SVar17 = pSVar8[1];
            pSVar8 = pSVar8 + 1;
          } while (SVar17 != no_square);
        }
        pSVar8 = this->bishops;
        if (*pSVar8 != no_square) {
          do {
            UVar9 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar8);
            uVar7 = this->qtarget & UVar9;
            if (uVar7 != 0) {
              SVar17 = *pSVar8;
              uVar13 = (ulong)this->last;
              pUVar16 = &this->list[uVar13].type;
              do {
                lVar3 = 0;
                if (uVar7 != 0) {
                  for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar16 + -2))->f = (char)SVar17;
                pUVar16[-1] = (U8)lVar3;
                *pUVar16 = '\n';
                pUVar16 = pUVar16 + 3;
                uVar14 = (int)uVar13 + 1;
                uVar13 = (ulong)uVar14;
                uVar7 = uVar7 & uVar7 - 1;
              } while (uVar7 != 0);
              this->last = uVar14;
            }
            uVar7 = UVar9 & this->ctarget;
            if (uVar7 != 0) {
              SVar17 = *pSVar8;
              uVar13 = (ulong)this->last;
              pUVar16 = &this->list[uVar13].type;
              do {
                lVar3 = 0;
                if (uVar7 != 0) {
                  for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar16 + -2))->f = (char)SVar17;
                pUVar16[-1] = (U8)lVar3;
                *pUVar16 = '\v';
                pUVar16 = pUVar16 + 3;
                uVar14 = (int)uVar13 + 1;
                uVar13 = (ulong)uVar14;
                uVar7 = uVar7 & uVar7 - 1;
              } while (uVar7 != 0);
              this->last = uVar14;
            }
            pSVar1 = pSVar8 + 1;
            pSVar8 = pSVar8 + 1;
          } while (*pSVar1 != no_square);
        }
        pSVar8 = this->rooks;
        if (*pSVar8 != no_square) {
          do {
            UVar9 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar8);
            uVar7 = this->qtarget & UVar9;
            if (uVar7 != 0) {
              SVar17 = *pSVar8;
              uVar13 = (ulong)this->last;
              pUVar16 = &this->list[uVar13].type;
              do {
                lVar3 = 0;
                if (uVar7 != 0) {
                  for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar16 + -2))->f = (char)SVar17;
                pUVar16[-1] = (U8)lVar3;
                *pUVar16 = '\n';
                pUVar16 = pUVar16 + 3;
                uVar14 = (int)uVar13 + 1;
                uVar13 = (ulong)uVar14;
                uVar7 = uVar7 & uVar7 - 1;
              } while (uVar7 != 0);
              this->last = uVar14;
            }
            uVar7 = UVar9 & this->ctarget;
            if (uVar7 != 0) {
              SVar17 = *pSVar8;
              uVar13 = (ulong)this->last;
              pUVar16 = &this->list[uVar13].type;
              do {
                lVar3 = 0;
                if (uVar7 != 0) {
                  for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar16 + -2))->f = (char)SVar17;
                pUVar16[-1] = (U8)lVar3;
                *pUVar16 = '\v';
                pUVar16 = pUVar16 + 3;
                uVar14 = (int)uVar13 + 1;
                uVar13 = (ulong)uVar14;
                uVar7 = uVar7 & uVar7 - 1;
              } while (uVar7 != 0);
              this->last = uVar14;
            }
            pSVar1 = pSVar8 + 1;
            pSVar8 = pSVar8 + 1;
          } while (*pSVar1 != no_square);
        }
        pSVar8 = this->queens;
        if (*pSVar8 != no_square) {
          do {
            UVar9 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar8);
            UVar10 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar8);
            uVar7 = this->qtarget & (UVar10 | UVar9);
            if (uVar7 != 0) {
              SVar17 = *pSVar8;
              uVar13 = (ulong)this->last;
              pUVar16 = &this->list[uVar13].type;
              do {
                lVar3 = 0;
                if (uVar7 != 0) {
                  for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar16 + -2))->f = (char)SVar17;
                pUVar16[-1] = (U8)lVar3;
                *pUVar16 = '\n';
                pUVar16 = pUVar16 + 3;
                uVar14 = (int)uVar13 + 1;
                uVar13 = (ulong)uVar14;
                uVar7 = uVar7 & uVar7 - 1;
              } while (uVar7 != 0);
              this->last = uVar14;
            }
            uVar7 = (UVar10 | UVar9) & this->ctarget;
            if (uVar7 != 0) {
              SVar17 = *pSVar8;
              uVar13 = (ulong)this->last;
              pUVar16 = &this->list[uVar13].type;
              do {
                lVar3 = 0;
                if (uVar7 != 0) {
                  for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar16 + -2))->f = (char)SVar17;
                pUVar16[-1] = (U8)lVar3;
                *pUVar16 = '\v';
                pUVar16 = pUVar16 + 3;
                uVar14 = (int)uVar13 + 1;
                uVar13 = (ulong)uVar14;
                uVar7 = uVar7 & uVar7 - 1;
              } while (uVar7 != 0);
              this->last = uVar14;
            }
            pSVar1 = pSVar8 + 1;
            pSVar8 = pSVar8 + 1;
          } while (*pSVar1 != no_square);
        }
        local_38 = this->pawns7;
        if (local_38 != 0) {
          pcVar12 = anon_unknown.dwarf_15ec2b::shift<(Dir)1>;
          if (this->us == white) {
            pcVar12 = anon_unknown.dwarf_15ec2b::shift<(Dir)0>;
          }
          (*pcVar12)(&local_38);
          local_38 = local_38 & this->qtarget;
          if (local_38 != 0) {
            CVar2 = this->us;
            uVar7 = (ulong)this->last;
            pUVar16 = &this->list[uVar7 + 3].type;
            do {
              lVar3 = 0;
              if (local_38 != 0) {
                for (; (local_38 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                }
              }
              UVar6 = (U8)lVar3;
              UVar18 = (CVar2 != white) * '\x10' + -8 + UVar6;
              uVar14 = (int)uVar7 + 4;
              uVar7 = (ulong)uVar14;
              pUVar16[-0xb] = UVar18;
              pUVar16[-10] = UVar6;
              pUVar16[-9] = 0;
              pUVar16[-8] = UVar18;
              pUVar16[-7] = UVar6;
              pUVar16[-6] = 1;
              pUVar16[-5] = UVar18;
              pUVar16[-4] = UVar6;
              pUVar16[-3] = 2;
              ((Move *)(pUVar16 + -2))->f = UVar18;
              pUVar16[-1] = UVar6;
              *pUVar16 = '\x03';
              pUVar16 = pUVar16 + 0xc;
              local_38 = local_38 & local_38 - 1;
            } while (local_38 != 0);
            this->last = uVar14;
          }
        }
        SVar17 = *this->kings;
        uVar7 = this->empty & (&bitboards::kmask)[SVar17];
        if (uVar7 != 0) {
          uVar13 = (ulong)this->last;
          pUVar16 = &this->list[uVar13].type;
          do {
            lVar3 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar16 + -2))->f = (U8)SVar17;
            pUVar16[-1] = (U8)lVar3;
            *pUVar16 = '\n';
            pUVar16 = pUVar16 + 3;
            uVar14 = (int)uVar13 + 1;
            uVar13 = (ulong)uVar14;
            uVar7 = uVar7 & uVar7 - 1;
          } while (uVar7 != 0);
          this->last = uVar14;
        }
        uVar7 = (ulong)this->us;
        local_40 = this->pawns;
        if (local_40 == 0) {
          return;
        }
        local_38 = *(ulong *)(bitboards::pawnmask + uVar7 * 8) & local_40;
        local_40 = local_40 & this->rank2;
        pcVar12 = anon_unknown.dwarf_15ec2b::shift<(Dir)1>;
        if (uVar7 == 0) {
          pcVar12 = anon_unknown.dwarf_15ec2b::shift<(Dir)0>;
        }
        (*pcVar12)(&local_38);
        local_38 = local_38 & this->qtarget;
        bVar5 = true;
        do {
          bVar20 = bVar5;
          (*pcVar12)(&local_40);
          local_40 = local_40 & this->empty;
          bVar5 = false;
        } while (bVar20);
        local_40 = (-(ulong)(this->evasion_target == 0) | this->evasion_target) & local_40;
        if (local_38 != 0) {
          uVar13 = (ulong)this->last;
          pUVar16 = &this->list[uVar13].type;
          do {
            lVar3 = 0;
            if (local_38 != 0) {
              for (; (local_38 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar16 + -2))->f = (U8)lVar3 + (uVar7 != 0) * '\x10' + -8;
            pUVar16[-1] = (U8)lVar3;
            *pUVar16 = '\n';
            pUVar16 = pUVar16 + 3;
            uVar14 = (int)uVar13 + 1;
            uVar13 = (ulong)uVar14;
            local_38 = local_38 & local_38 - 1;
          } while (local_38 != 0);
          this->last = uVar14;
        }
        if (local_40 == 0) {
          return;
        }
        uVar13 = (ulong)this->last;
        pUVar16 = &this->list[uVar13].type;
        do {
          lVar3 = 0;
          if (local_40 != 0) {
            for (; (local_40 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
            }
          }
          ((Move *)(pUVar16 + -2))->f = (uVar7 != 0) * ' ' + -0x10 + (U8)lVar3;
          pUVar16[-1] = (U8)lVar3;
          *pUVar16 = '\n';
          pUVar16 = pUVar16 + 3;
          uVar14 = (int)uVar13 + 1;
          uVar13 = (ulong)uVar14;
          local_40 = local_40 & local_40 - 1;
        } while (local_40 != 0);
        this->last = uVar14;
        return;
      }
      uVar7 = (&bitboards::kmask)[*this->kings];
      uVar13 = this->enemies & uVar7;
      UVar6 = (U8)*this->kings;
      if (uVar13 != 0) {
        uVar15 = (ulong)this->last;
        pUVar16 = &this->list[uVar15].type;
        do {
          lVar3 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
            }
          }
          ((Move *)(pUVar16 + -2))->f = UVar6;
          pUVar16[-1] = (U8)lVar3;
          *pUVar16 = '\v';
          pUVar16 = pUVar16 + 3;
          uVar14 = (int)uVar15 + 1;
          uVar15 = (ulong)uVar14;
          uVar13 = uVar13 & uVar13 - 1;
        } while (uVar13 != 0);
        this->last = uVar14;
      }
      uVar7 = uVar7 & this->empty;
      if (uVar7 == 0) {
        return;
      }
      uVar13 = (ulong)this->last;
      pUVar16 = &this->list[uVar13].type;
      do {
        lVar3 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        ((Move *)(pUVar16 + -2))->f = UVar6;
        pUVar16[-1] = (U8)lVar3;
        *pUVar16 = '\n';
        pUVar16 = pUVar16 + 3;
        uVar14 = (int)uVar13 + 1;
        uVar13 = (ulong)uVar14;
        uVar7 = uVar7 & uVar7 - 1;
      } while (uVar7 != 0);
    }
  }
  this->last = uVar14;
  return;
}

Assistant:

inline void Movegen::generate<pseudo_legal, pieces>() {
	// todo: order move generation by game phase
	// data-driven approach for this?
	if (check_target == 0ULL) { // all moves
		generate<capture_promotion, pawn>();
		generate<promotion, pawn>();
		generate<pseudo_legal, knight>();
		generate<pseudo_legal, bishop>();
		generate<pseudo_legal, rook>();
		generate<pseudo_legal, queen>();
		generate<capture, pawn>();
		generate<quiet, pawn>();
		generate<quiet, king>();
		generate<castles, king>();
		generate<capture, king>();
	}
	else if (check_target != 0ULL && evasion_target == 0ULL) {
		if (!bits::more_than_one(check_target)) {
			generate<capture_promotion, pawn>();
			generate<capture, king>();
			generate<capture, pawn>();
			generate<capture, knight>();
			generate<capture, bishop>();
			generate<capture, rook>();
			generate<capture, queen>();
			generate<quiet, king>();
		}
		else {
			generate<capture, king>();
			generate<quiet, king>(); // more than one checker
		}
	}
	else if (check_target != 0ULL && evasion_target != 0ULL) {
		if (!bits::more_than_one(check_target)) {
			// capture moves
			generate<capture_promotion, pawn>();
			generate<capture, king>();
			generate<capture, pawn>();
			generate<pseudo_legal, knight>();
			generate<pseudo_legal, bishop>();
			generate<pseudo_legal, rook>();
			generate<pseudo_legal, queen>();

			// blocking moves
			generate<promotion, pawn>();
			generate<quiet, king>();
			generate<quiet, pawn>();
		}
		else {
			generate<capture, king>();
			generate<quiet, king>(); // more than one checker
		}
	}
}